

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall
Memory::HeapInfo::HeapInfo
          (HeapInfo *this,AllocationPolicyManager *policyManager,ConfigFlagsTable *configFlagsTable,
          IdleDecommitPageAllocator *leafPageAllocator)

{
  HeapBucketGroup<MediumAllocationBlockAttributes> *local_68;
  HeapBucketGroup<SmallAllocationBlockAttributes> *local_40;
  IdleDecommitPageAllocator *leafPageAllocator_local;
  ConfigFlagsTable *configFlagsTable_local;
  AllocationPolicyManager *policyManager_local;
  HeapInfo *this_local;
  
  this->recycler = (Recycler *)0x0;
  this->newLeafHeapBlockList = (SmallLeafHeapBlock *)0x0;
  this->newNormalHeapBlockList = (SmallNormalHeapBlock *)0x0;
  this->newFinalizableHeapBlockList = (SmallFinalizableHeapBlock *)0x0;
  this->newNormalWithBarrierHeapBlockList = (SmallNormalWithBarrierHeapBlock *)0x0;
  this->newFinalizableWithBarrierHeapBlockList = (SmallFinalizableWithBarrierHeapBlock *)0x0;
  this->newMediumLeafHeapBlockList = (MediumLeafHeapBlock *)0x0;
  this->newMediumNormalHeapBlockList = (MediumNormalHeapBlock *)0x0;
  this->newMediumFinalizableHeapBlockList = (MediumFinalizableHeapBlock *)0x0;
  this->newMediumNormalWithBarrierHeapBlockList = (MediumNormalWithBarrierHeapBlock *)0x0;
  this->newMediumFinalizableWithBarrierHeapBlockList = (MediumFinalizableWithBarrierHeapBlock *)0x0;
  this->pageHeapMode = PageHeapModeOff;
  this->isPageHeapEnabled = false;
  BVStatic<48UL>::BVStatic(&this->smallBlockPageHeapBucketFilter);
  BVStatic<29UL>::BVStatic(&this->mediumBlockPageHeapBucketFilter);
  this->captureAllocCallStack = false;
  this->captureFreeCallStack = false;
  this->pageHeapBlockType = PageHeapBlockTypeFilterAll;
  local_40 = this->heapBuckets;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::HeapBucketGroup(local_40);
    local_40 = local_40 + 1;
  } while ((HeapBucketGroup<MediumAllocationBlockAttributes> *)local_40 != this->mediumHeapBuckets);
  local_68 = this->mediumHeapBuckets;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::HeapBucketGroup(local_68);
    local_68 = local_68 + 1;
  } while (local_68 != (HeapBucketGroup<MediumAllocationBlockAttributes> *)&this->largeObjectBucket)
  ;
  LargeHeapBucket::LargeHeapBucket(&this->largeObjectBucket);
  this->hasPendingTransferDisposedObjects = false;
  this->liveFinalizableObjectCount = 0;
  this->newFinalizableObjectCount = 0;
  this->pendingDisposableObjectCount = 0;
  this->recyclerLeafPageAllocator = leafPageAllocator;
  RecyclerPageAllocator::RecyclerPageAllocator
            (&this->recyclerWithBarrierPageAllocator,this,policyManager,configFlagsTable,
             RecyclerHeuristic::Instance.DefaultMaxFreePageCount,0x20,true);
  RecyclerPageAllocator::RecyclerPageAllocator
            (&this->recyclerPageAllocator,this,policyManager,configFlagsTable,
             RecyclerHeuristic::Instance.DefaultMaxFreePageCount,
             RecyclerHeuristic::Instance.DefaultMaxAllocPageCount,false);
  RecyclerPageAllocator::RecyclerPageAllocator
            (&this->recyclerLargeBlockPageAllocator,this,policyManager,configFlagsTable,
             RecyclerHeuristic::Instance.DefaultMaxFreePageCount,0x20,false);
  (this->recyclerPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.debugName =
       L"Recycler";
  (this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
  debugName = L"RecyclerLargeBlock";
  (this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator.super_PageAllocator.
  debugName = L"RecyclerWithBarrier";
  return;
}

Assistant:

HeapInfo::HeapInfo(AllocationPolicyManager * policyManager, Js::ConfigFlagsTable& configFlagsTable, IdleDecommitPageAllocator * leafPageAllocator) :
    recycler(nullptr),
    recyclerLeafPageAllocator(leafPageAllocator),
    recyclerPageAllocator(this, policyManager, configFlagsTable, RecyclerHeuristic::Instance.DefaultMaxFreePageCount, RecyclerHeuristic::Instance.DefaultMaxAllocPageCount),
    recyclerLargeBlockPageAllocator(this, policyManager, configFlagsTable, RecyclerHeuristic::Instance.DefaultMaxFreePageCount),
#ifdef RECYCLER_WRITE_BARRIER_ALLOC_SEPARATE_PAGE
    recyclerWithBarrierPageAllocator(this, policyManager, configFlagsTable, RecyclerHeuristic::Instance.DefaultMaxFreePageCount, PageAllocator::DefaultMaxAllocPageCount, true),
#endif
#if ENABLE_CONCURRENT_GC
    newLeafHeapBlockList(nullptr),
    newNormalHeapBlockList(nullptr),
#ifdef RECYCLER_WRITE_BARRIER
    newNormalWithBarrierHeapBlockList(nullptr),
    newFinalizableWithBarrierHeapBlockList(nullptr),
#endif
    newFinalizableHeapBlockList(nullptr),
#ifdef RECYCLER_VISITED_HOST
    newRecyclerVisitedHostHeapBlockList(nullptr),
#endif
    newMediumLeafHeapBlockList(nullptr),
    newMediumNormalHeapBlockList(nullptr),
#ifdef RECYCLER_WRITE_BARRIER
    newMediumNormalWithBarrierHeapBlockList(nullptr),
    newMediumFinalizableWithBarrierHeapBlockList(nullptr),
#endif
#ifdef RECYCLER_VISITED_HOST
    newMediumRecyclerVisitedHostHeapBlockList(nullptr),
#endif
    newMediumFinalizableHeapBlockList(nullptr),
#endif
#ifdef RECYCLER_FINALIZE_CHECK
    liveFinalizableObjectCount(0),
    pendingDisposableObjectCount(0),
    newFinalizableObjectCount(0),
#endif
#ifdef RECYCLER_PAGE_HEAP
    pageHeapMode(PageHeapMode::PageHeapModeOff),
    isPageHeapEnabled(false),
    pageHeapBlockType(PageHeapBlockTypeFilter::PageHeapBlockTypeFilterAll),
    captureAllocCallStack(false),
    captureFreeCallStack(false),
#endif
    hasPendingTransferDisposedObjects(false)
{
#if DBG_DUMP
    recyclerPageAllocator.debugName = _u("Recycler");
    recyclerLargeBlockPageAllocator.debugName = _u("RecyclerLargeBlock");
#ifdef RECYCLER_WRITE_BARRIER_ALLOC_SEPARATE_PAGE
    recyclerWithBarrierPageAllocator.debugName = _u("RecyclerWithBarrier");
#endif
#endif
}